

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

Color * LoadImagePalette(Image image,int maxPaletteSize,int *colorCount)

{
  ulong uVar1;
  Image image_00;
  int iVar2;
  Color *__ptr;
  Color *__s;
  int iVar3;
  ulong uVar4;
  int iVar5;
  undefined8 unaff_R13;
  undefined8 unaff_R14;
  undefined8 unaff_R15;
  
  uVar1 = (ulong)(uint)maxPaletteSize;
  image_00._8_8_ = unaff_R14;
  image_00.data = (void *)unaff_R13;
  image_00._16_8_ = unaff_R15;
  __ptr = LoadImageColors(image_00);
  if (__ptr == (Color *)0x0) {
    __s = (Color *)0x0;
    iVar3 = 0;
  }
  else {
    __s = (Color *)malloc((long)maxPaletteSize * 4);
    if (0 < maxPaletteSize) {
      memset(__s,0,uVar1 * 4);
    }
    iVar5 = image.height * image.width;
    if (iVar5 < 1) {
      iVar3 = 0;
    }
    else {
      iVar2 = 0;
      iVar3 = 0;
      do {
        if (__ptr[iVar2].a != '\0') {
          if (0 < maxPaletteSize) {
            uVar4 = 0;
            do {
              if ((((__ptr[iVar2].r == __s[uVar4].r) && (__ptr[iVar2].g == __s[uVar4].g)) &&
                  (__ptr[iVar2].b == __s[uVar4].b)) && (__ptr[iVar2].a == __s[uVar4].a))
              goto LAB_0019a426;
              uVar4 = uVar4 + 1;
            } while (uVar1 != uVar4);
          }
          __s[iVar3] = __ptr[iVar2];
          iVar3 = iVar3 + 1;
          if (maxPaletteSize <= iVar3) {
            TraceLog(4,"IMAGE: Palette is greater than %i colors",uVar1);
            iVar2 = iVar5;
          }
        }
LAB_0019a426:
        iVar2 = iVar2 + 1;
      } while (iVar2 < iVar5);
    }
    free(__ptr);
  }
  *colorCount = iVar3;
  return __s;
}

Assistant:

Color *LoadImagePalette(Image image, int maxPaletteSize, int *colorCount)
{
    #define COLOR_EQUAL(col1, col2) ((col1.r == col2.r)&&(col1.g == col2.g)&&(col1.b == col2.b)&&(col1.a == col2.a))

    int palCount = 0;
    Color *palette = NULL;
    Color *pixels = LoadImageColors(image);

    if (pixels != NULL)
    {
        palette = (Color *)RL_MALLOC(maxPaletteSize*sizeof(Color));

        for (int i = 0; i < maxPaletteSize; i++) palette[i] = BLANK;   // Set all colors to BLANK

        for (int i = 0; i < image.width*image.height; i++)
        {
            if (pixels[i].a > 0)
            {
                bool colorInPalette = false;

                // Check if the color is already on palette
                for (int j = 0; j < maxPaletteSize; j++)
                {
                    if (COLOR_EQUAL(pixels[i], palette[j]))
                    {
                        colorInPalette = true;
                        break;
                    }
                }

                // Store color if not on the palette
                if (!colorInPalette)
                {
                    palette[palCount] = pixels[i];      // Add pixels[i] to palette
                    palCount++;

                    // We reached the limit of colors supported by palette
                    if (palCount >= maxPaletteSize)
                    {
                        i = image.width*image.height;   // Finish palette get
                        TRACELOG(LOG_WARNING, "IMAGE: Palette is greater than %i colors", maxPaletteSize);
                    }
                }
            }
        }

        UnloadImageColors(pixels);
    }

    *colorCount = palCount;

    return palette;
}